

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
I2sSimulationDataGenerator::Initialize
          (I2sSimulationDataGenerator *this,U32 simulation_sample_rate,I2sAnalyzerSettings *settings
          )

{
  SimulationChannelDescriptorGroup *pSVar1;
  U32 UVar2;
  PcmFrameType PVar3;
  iterator iVar4;
  iterator iVar5;
  SimulationChannelDescriptor *pSVar6;
  S64 SVar7;
  U32 UVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  U64 mask;
  unsigned_long_long local_38;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  pSVar1 = &this->mSimulationChannels;
  pSVar6 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)settings + 0x10,simulation_sample_rate);
  this->mClock = pSVar6;
  pSVar6 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)this->mSettings + 0x20,this->mSimulationSampleRateHz);
  this->mFrame = pSVar6;
  pSVar6 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)this->mSettings + 0x30,this->mSimulationSampleRateHz);
  this->mData = pSVar6;
  InitSineWave(this);
  ClockGenerator::Init
            ((double)(this->mNumPaddingBits + this->mSettings->mBitsPerWord) *
             (this->mAudioSampleRate + this->mAudioSampleRate),(int)this + 0x60);
  this->mCurrentAudioWordIndex = 0;
  this->mCurrentAudioChannel = Left;
  this->mPaddingCount = 0;
  UVar2 = this->mSettings->mBitsPerWord;
  if (this->mSettings->mShiftOrder == MsbFirst) {
    local_38 = 1L << ((char)UVar2 - 1U & 0x3f);
    if (UVar2 != 0) {
      UVar8 = UVar2;
      do {
        iVar4._M_current =
             (this->mBitMasks).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->mBitMasks).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     &this->mBitMasks,iVar4,&local_38);
        }
        else {
          *iVar4._M_current = local_38;
          (this->mBitMasks).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_38 = local_38 >> 1;
        UVar8 = UVar8 - 1;
      } while (UVar8 != 0);
    }
  }
  else {
    local_38 = 1;
    if (UVar2 != 0) {
      UVar8 = UVar2;
      do {
        iVar4._M_current =
             (this->mBitMasks).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->mBitMasks).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     &this->mBitMasks,iVar4,&local_38);
        }
        else {
          *iVar4._M_current = local_38;
          (this->mBitMasks).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_38 = local_38 << 1;
        UVar8 = UVar8 - 1;
      } while (UVar8 != 0);
    }
  }
  UVar8 = this->mNumPaddingBits;
  uVar9 = UVar8 + UVar2;
  PVar3 = this->mSettings->mFrameType;
  if (PVar3 == FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS) {
    if (this->mUseShortFrames == false) {
      iVar10 = uVar9 * 2;
      if (iVar10 != 0) {
        iVar12 = iVar10;
        do {
          local_38 = CONCAT44(local_38._4_4_,1);
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_HIGH;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        do {
          local_38 = local_38 & 0xffffffff00000000;
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_LOW;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
    }
    else {
      local_38 = CONCAT44(local_38._4_4_,1);
      iVar5._M_current =
           (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                  (&this->mFrameBits,iVar5,(BitState *)&local_38);
      }
      else {
        *iVar5._M_current = BIT_HIGH;
        (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      if (uVar9 * 4 != 0) {
        iVar10 = uVar9 * 4 + -1;
        do {
          local_38 = local_38 & 0xffffffff00000000;
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_LOW;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
    }
  }
  else if (PVar3 == FRAME_TRANSITION_ONCE_EVERY_WORD) {
    if (this->mUseShortFrames == false) {
      if (uVar9 != 0) {
        uVar11 = uVar9;
        do {
          local_38 = CONCAT44(local_38._4_4_,1);
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_HIGH;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
        do {
          local_38 = local_38 & 0xffffffff00000000;
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_LOW;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
    }
    else {
      local_38 = CONCAT44(local_38._4_4_,1);
      iVar5._M_current =
           (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                  (&this->mFrameBits,iVar5,(BitState *)&local_38);
      }
      else {
        *iVar5._M_current = BIT_HIGH;
        (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      if (uVar9 * 2 != 0) {
        iVar10 = uVar9 * 2 + -1;
        do {
          local_38 = local_38 & 0xffffffff00000000;
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_LOW;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
    }
  }
  else if (PVar3 == FRAME_TRANSITION_TWICE_EVERY_WORD) {
    if (this->mUseShortFrames == false) {
      uVar11 = uVar9 >> 1;
      if (1 < uVar9) {
        iVar10 = uVar11 + (uVar11 == 0);
        do {
          local_38 = CONCAT44(local_38._4_4_,1);
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_HIGH;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      if (uVar9 != 0) {
        iVar10 = (uVar9 - uVar11) + (uint)(uVar9 - uVar11 == 0);
        do {
          local_38 = local_38 & 0xffffffff00000000;
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_LOW;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
    }
    else {
      local_38 = CONCAT44(local_38._4_4_,1);
      iVar5._M_current =
           (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                  (&this->mFrameBits,iVar5,(BitState *)&local_38);
      }
      else {
        *iVar5._M_current = BIT_HIGH;
        (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      if (1 < uVar9) {
        iVar10 = UVar8 + UVar2 + -1;
        do {
          local_38 = local_38 & 0xffffffff00000000;
          iVar5._M_current =
               (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BitState,_std::allocator<BitState>_>::_M_realloc_insert<BitState>
                      (&this->mFrameBits,iVar5,(BitState *)&local_38);
          }
          else {
            *iVar5._M_current = BIT_LOW;
            (this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
    }
  }
  else {
    AnalyzerHelpers::Assert("unexpected");
  }
  SVar7 = GetNextAudioWord(this);
  this->mCurrentWord = SVar7;
  this->mCurrentBitIndex = 0;
  this->mCurrentFrameBitIndex = 0;
  this->mBitGenerationState = Init;
  return;
}

Assistant:

void I2sSimulationDataGenerator::Initialize( U32 simulation_sample_rate, I2sAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    if( mSettings->mDataValidEdge == AnalyzerEnums::NegEdge )
        mClock = mSimulationChannels.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
    else
        mClock = mSimulationChannels.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );

    mFrame = mSimulationChannels.Add( mSettings->mFrameChannel, mSimulationSampleRateHz, BIT_LOW );
    mData = mSimulationChannels.Add( mSettings->mDataChannel, mSimulationSampleRateHz, BIT_LOW );

    InitSineWave();
    double bits_per_s = mAudioSampleRate * 2.0 * double( mSettings->mBitsPerWord + mNumPaddingBits );
    mClockGenerator.Init( bits_per_s, mSimulationSampleRateHz );

    mCurrentAudioWordIndex = 0;
    mCurrentAudioChannel = Left;
    mPaddingCount = 0;

    U64 audio_bit_depth = mSettings->mBitsPerWord;

    if( mSettings->mShiftOrder == AnalyzerEnums::MsbFirst )
    {
        U64 mask = 1ULL << ( audio_bit_depth - 1 );
        for( U32 i = 0; i < audio_bit_depth; i++ )
        {
            mBitMasks.push_back( mask );
            mask = mask >> 1;
        }
    }
    else
    {
        U64 mask = 1;
        for( U32 i = 0; i < audio_bit_depth; i++ )
        {
            mBitMasks.push_back( mask );
            mask = mask << 1;
        }
    }

    // enum PcmFrameType { FRAME_TRANSITION_TWICE_EVERY_WORD, FRAME_TRANSITION_ONCE_EVERY_WORD, FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS };
    U32 bits_per_word = audio_bit_depth + mNumPaddingBits;
    switch( mSettings->mFrameType )
    {
    case FRAME_TRANSITION_TWICE_EVERY_WORD:
        if( mUseShortFrames == false )
        {
            U32 high_count = bits_per_word / 2;
            U32 low_count = bits_per_word - high_count;
            for( U32 i = 0; i < high_count; i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < low_count; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    case FRAME_TRANSITION_ONCE_EVERY_WORD:
        if( mUseShortFrames == false )
        {
            for( U32 i = 0; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < bits_per_word; i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    case FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS:
        if( mUseShortFrames == false )
        {
            for( U32 i = 0; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 0; i < ( bits_per_word * 2 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        else
        {
            mFrameBits.push_back( BIT_HIGH );
            for( U32 i = 1; i < ( bits_per_word * 4 ); i++ )
                mFrameBits.push_back( BIT_LOW );
        }
        break;
    default:
        AnalyzerHelpers::Assert( "unexpected" );
        break;
    }

    mCurrentWord = GetNextAudioWord();
    mCurrentBitIndex = 0;
    mCurrentFrameBitIndex = 0;
    mBitGenerationState = Init;
}